

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-amiga.cc
# Opt level: O3

PSprite __thiscall DataSourceAmiga::get_map_object_sprite(DataSourceAmiga *this,size_t index)

{
  byte compression;
  byte bVar1;
  ushort uVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar3;
  byte bVar4;
  bool bVar5;
  ushort uVar6;
  int iVar7;
  uint uVar8;
  PBuffer *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  byte filling;
  byte bVar10;
  byte bVar11;
  PBuffer PVar12;
  PSprite PVar13;
  PBuffer data;
  undefined8 local_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  PSpriteAmiga mask;
  undefined1 local_60 [8];
  element_type *local_58;
  PSpriteAmiga pixels;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  undefined8 local_38;
  
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(index + 0x60);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  PVar12 = get_data_from_catalog((DataSourceAmiga *)&data,index,6,in_RDX);
  _Var9 = PVar12.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    _Var9._M_pi = extraout_RDX;
  }
  if (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    _Var9._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->read;
    uVar2 = *(ushort *)((long)&(_Var9._M_pi)->_vptr__Sp_counted_base + 2);
    (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->read =
         (uint8_t *)((long)&(_Var9._M_pi)->_vptr__Sp_counted_base + 4);
    uVar6 = uVar2 << 8 | uVar2 >> 8;
    if ((data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->endianess !=
        EndianessBig) {
      uVar6 = uVar2;
    }
    bVar4 = *(byte *)((long)&(_Var9._M_pi)->_vptr__Sp_counted_base + 4);
    (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->read =
         (uint8_t *)((long)&(_Var9._M_pi)->_vptr__Sp_counted_base + 5);
    compression = *(byte *)((long)&(_Var9._M_pi)->_vptr__Sp_counted_base + 5);
    (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->read =
         (uint8_t *)((long)&(_Var9._M_pi)->_vptr__Sp_counted_base + 6);
    bVar1 = *(byte *)((long)&(_Var9._M_pi)->_vptr__Sp_counted_base + 6);
    (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->read =
         (uint8_t *)((long)&(_Var9._M_pi)->_vptr__Sp_counted_base + 7);
    bVar10 = *(byte *)((long)&(_Var9._M_pi)->_vptr__Sp_counted_base + 7);
    (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->read =
         (uint8_t *)&(_Var9._M_pi)->_M_use_count;
    if (compression != 0) {
      if (bVar4 == 0) {
        bVar4 = (byte)(uVar6 / compression);
      }
      bVar11 = 0;
      filling = 0;
      bVar3 = true;
      do {
        bVar5 = bVar3;
        filling = filling >> 1;
        bVar11 = bVar11 >> 1;
        if ((char)bVar10 < '\0') {
          filling = filling | 0x10;
          bVar11 = bVar11 | bVar10 >> 2 & 0x10;
          bVar10 = bVar10 * '\x02';
        }
        bVar10 = bVar10 * '\x02';
        bVar3 = false;
      } while (bVar5);
      local_90 = data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_88 = data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi)->_M_use_count + 1;
        }
      }
      decode_mask_sprite((DataSourceAmiga *)&mask,(PBuffer *)(ulong)compression,(size_t)&local_90,
                         (ulong)((uint)bVar4 * 8));
      if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
      }
      Buffer::pop_tail((Buffer *)local_60);
      decode_planned_sprite
                ((DataSourceAmiga *)&pixels,(PBuffer *)(ulong)bVar11,(size_t)local_60,(ulong)bVar4,
                 compression,filling,(uint8_t *)(ulong)bVar11,false);
      if (local_58 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58);
      }
      _Var9._M_pi = mask.
                    super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      if (mask.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (mask.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (mask.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (mask.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (mask.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      SpriteAmiga::get_amiga_masked
                ((SpriteAmiga *)&local_40,
                 (PSprite *)
                 pixels.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
      if (_Var9._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var9._M_pi);
      }
      local_40._M_pi[1]._M_use_count = 1;
      local_40._M_pi[1]._M_weak_count = 0;
      iVar7 = 0;
      if (((ulong)in_RDX & 0xfffffffffffffff0) != 0x80) {
        iVar7 = (uint)bVar4 * -4;
      }
      uVar8 = -(uint)bVar1;
      _Var9._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)uVar8;
      *(int *)&local_40._M_pi[2]._vptr__Sp_counted_base = iVar7;
      *(uint *)((long)&local_40._M_pi[2]._vptr__Sp_counted_base + 4) = uVar8;
      (this->super_DataSourceLegacy).super_DataSourceBase.super_Source._vptr_Source =
           (_func_int **)local_40._M_pi;
      (this->super_DataSourceLegacy).super_DataSourceBase.path._M_dataplus._M_p = (pointer)local_38;
      if (pixels.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (pixels.
                   super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        _Var9._M_pi = extraout_RDX_00;
      }
      if (mask.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (mask.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
        _Var9._M_pi = extraout_RDX_01;
      }
      goto LAB_001337c3;
    }
  }
  (this->super_DataSourceLegacy).super_DataSourceBase.super_Source._vptr_Source = (_func_int **)0x0;
  (this->super_DataSourceLegacy).super_DataSourceBase.path._M_dataplus._M_p = (pointer)0x0;
LAB_001337c3:
  if (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    _Var9._M_pi = extraout_RDX_02;
  }
  PVar13.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var9._M_pi;
  PVar13.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (PSprite)PVar13.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Data::PSprite
DataSourceAmiga::get_map_object_sprite(size_t index) {
  PBuffer data = get_data_from_catalog(6, index, gfxchip);
  if (!data) {
    return nullptr;
  }

  data->pop<uint16_t>();  // drop shadow_offset
  uint16_t bitplane_size = data->pop<uint16_t>();
  uint8_t width = data->pop<uint8_t>();
  uint8_t height = data->pop<uint8_t>();
  uint8_t offset_y = data->pop<uint8_t>();
  uint8_t compression = data->pop<uint8_t>();

  if (height == 0) {
    return nullptr;
  }
  if (width == 0) {
    width = bitplane_size / height;
  }

  uint8_t compressed = 0;
  uint8_t filled = 0;
  for (int i = 0 ; i < 2 ; i++) {
    compressed  = compressed >> 1;
    filled = filled >> 1;

    if (compression & 0x80) {
      compressed = compressed | 0x10;
      if (compression & 0x40) {
        filled = filled | 0x10;
      }
      compression = compression << 1;
    }
    compression = compression << 1;
  }

  PSpriteAmiga mask = decode_mask_sprite(data, width * 8, height);
  PSpriteAmiga pixels = decode_planned_sprite(data->pop_tail(), width, height,
                                              compressed, filled, palette);

  PSpriteAmiga sprite = pixels->get_amiga_masked(mask);
  sprite->set_delta(1, 0);
  if ((index >= 128) && (index <= 143)) {
    sprite->set_offset(0, -offset_y);
  } else {
    sprite->set_offset(-width * 4, -offset_y);
  }

  return sprite;
}